

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O2

bool __thiscall
absl::lts_20240722::base_internal::
AtomicHook<void_(*)(const_char_*,_int,_const_char_*,_const_char_*,_const_char_*)>::DoStore
          (AtomicHook<void_(*)(const_char_*,_int,_const_char_*,_const_char_*,_const_char_*)> *this,
          FnPtr fn)

{
  FnPtr p_Var1;
  FnPtr p_Var2;
  bool bVar3;
  
  if (fn == (FnPtr)0x0) {
    __assert_fail("fn",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/base/internal/atomic_hook.h"
                  ,0x99,
                  "bool absl::base_internal::AtomicHook<void (*)(const char *, int, const char *, const char *, const char *)>::DoStore(FnPtr) [T = void (*)(const char *, int, const char *, const char *, const char *)]"
                 );
  }
  p_Var1 = this->default_fn_;
  LOCK();
  p_Var2 = (this->hook_)._M_b._M_p;
  bVar3 = p_Var1 == p_Var2;
  if (bVar3) {
    (this->hook_)._M_b._M_p = fn;
    p_Var2 = p_Var1;
  }
  UNLOCK();
  if (bVar3) {
    p_Var2 = p_Var1;
  }
  return p_Var2 == fn || bVar3;
}

Assistant:

bool DoStore(FnPtr fn) {
    assert(fn);
    FnPtr expected = default_fn_;
    const bool store_succeeded = hook_.compare_exchange_strong(
        expected, fn, std::memory_order_acq_rel, std::memory_order_acquire);
    const bool same_value_already_stored = (expected == fn);
    return store_succeeded || same_value_already_stored;
  }